

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retArea.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkRetimeMinAreaOne(Abc_Ntk_t *pNtk,int fForward,int fVerbose)

{
  uint *puVar1;
  ulong uVar2;
  undefined4 uVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint *puVar9;
  void *pvVar10;
  Vec_Ptr_t *pVVar11;
  int *piVar12;
  Abc_Obj_t *pAVar13;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *pVVar14;
  long lVar15;
  int Fill;
  uint uVar16;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  Abc_Ntk_t *pNtk_00;
  
  if (fForward == 0) {
    pVVar11 = pNtk->vPis;
    if (0 < pVVar11->nSize) {
      lVar8 = 0;
      do {
        puVar9 = (uint *)((long)pVVar11->pArray[lVar8] + 0x14);
        *puVar9 = *puVar9 | 0x10;
        lVar8 = lVar8 + 1;
        pVVar11 = pNtk->vPis;
      } while (lVar8 < pVVar11->nSize);
    }
    pVVar11 = pNtk->vBoxes;
    if (0 < pVVar11->nSize) {
      lVar8 = 0;
      do {
        plVar4 = (long *)pVVar11->pArray[lVar8];
        if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
          *(uint *)((long)plVar4 + 0x14) = *(uint *)((long)plVar4 + 0x14) | 0x10;
          puVar9 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                     (long)*(int *)plVar4[6] * 8) + 0x14);
          *puVar9 = *puVar9 | 0x10;
          pVVar11 = pNtk->vBoxes;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar11->nSize);
    }
    pVVar11 = pNtk->vPos;
    if (0 < pVVar11->nSize) {
      lVar8 = 0;
      do {
        Abc_NtkMarkCone_rec((Abc_Obj_t *)pVVar11->pArray[lVar8],0);
        lVar8 = lVar8 + 1;
        pVVar11 = pNtk->vPos;
      } while (lVar8 < pVVar11->nSize);
    }
  }
  else {
    pVVar11 = pNtk->vPos;
    if (0 < pVVar11->nSize) {
      lVar8 = 0;
      do {
        puVar9 = (uint *)((long)pVVar11->pArray[lVar8] + 0x14);
        *puVar9 = *puVar9 | 0x10;
        lVar8 = lVar8 + 1;
        pVVar11 = pNtk->vPos;
      } while (lVar8 < pVVar11->nSize);
    }
    pVVar11 = pNtk->vBoxes;
    if (0 < pVVar11->nSize) {
      lVar8 = 0;
      do {
        plVar4 = (long *)pVVar11->pArray[lVar8];
        if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
          *(uint *)((long)plVar4 + 0x14) = *(uint *)((long)plVar4 + 0x14) | 0x10;
          puVar9 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                     (long)*(int *)plVar4[4] * 8) + 0x14);
          *puVar9 = *puVar9 | 0x10;
          pVVar11 = pNtk->vBoxes;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar11->nSize);
    }
    pVVar11 = pNtk->vPis;
    if (0 < pVVar11->nSize) {
      lVar8 = 0;
      do {
        Abc_NtkMarkCone_rec((Abc_Obj_t *)pVVar11->pArray[lVar8],1);
        lVar8 = lVar8 + 1;
        pVVar11 = pNtk->vPis;
      } while (lVar8 < pVVar11->nSize);
    }
    puVar9 = (uint *)malloc(0x10);
    puVar9[0] = 100;
    puVar9[1] = 0;
    pvVar10 = malloc(800);
    *(void **)(puVar9 + 2) = pvVar10;
    pVVar11 = pNtk->vObjs;
    if (pVVar11->nSize < 1) {
LAB_0045643a:
      if (pvVar10 != (void *)0x0) goto LAB_0045643f;
    }
    else {
      uVar16 = 0;
      uVar19 = 100;
      lVar8 = 0;
      do {
        plVar4 = (long *)pVVar11->pArray[lVar8];
        if (((plVar4 != (long *)0x0) && ((*(byte *)((long)plVar4 + 0x14) & 0x10) != 0)) &&
           (iVar6 = *(int *)((long)plVar4 + 0x1c), 0 < iVar6)) {
          lVar17 = 0;
          do {
            lVar5 = *(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                             (long)*(int *)(plVar4[4] + lVar17 * 4) * 8);
            if ((*(byte *)(lVar5 + 0x14) & 0x10) == 0) {
              uVar18 = (uint)uVar19;
              if (uVar16 == uVar18) {
                if ((int)uVar18 < 0x10) {
                  if (*(void **)(puVar9 + 2) == (void *)0x0) {
                    pvVar10 = malloc(0x80);
                  }
                  else {
                    pvVar10 = realloc(*(void **)(puVar9 + 2),0x80);
                  }
                  *(void **)(puVar9 + 2) = pvVar10;
                  *puVar9 = 0x10;
                  uVar19 = 0x10;
                }
                else {
                  uVar19 = (ulong)(uVar18 * 2);
                  if (*(void **)(puVar9 + 2) == (void *)0x0) {
                    pvVar10 = malloc(uVar19 * 8);
                  }
                  else {
                    pvVar10 = realloc(*(void **)(puVar9 + 2),uVar19 * 8);
                  }
                  *(void **)(puVar9 + 2) = pvVar10;
                  *puVar9 = uVar18 * 2;
                }
              }
              else {
                pvVar10 = *(void **)(puVar9 + 2);
              }
              lVar15 = (long)(int)uVar16;
              uVar16 = uVar16 + 1;
              puVar9[1] = uVar16;
              *(long *)((long)pvVar10 + lVar15 * 8) = lVar5;
              iVar6 = *(int *)((long)plVar4 + 0x1c);
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < iVar6);
          pVVar11 = pNtk->vObjs;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar11->nSize);
      pvVar10 = *(void **)(puVar9 + 2);
      if ((int)uVar16 < 1) goto LAB_0045643a;
      uVar19 = 0;
      do {
        puVar1 = (uint *)(*(long *)((long)pvVar10 + uVar19 * 8) + 0x14);
        *puVar1 = *puVar1 | 0x10;
        uVar19 = uVar19 + 1;
      } while (uVar16 != uVar19);
LAB_0045643f:
      free(pvVar10);
    }
    free(puVar9);
  }
  pVVar11 = Abc_NtkMaxFlow(pNtk,fForward,fVerbose);
  if (pVVar11->nSize < pNtk->nObjCounts[8]) {
    if (fForward == 0) {
      pNtk_00 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
      uVar19 = extraout_RDX;
      if ((pNtk->vTravIds).pArray == (int *)0x0) {
        iVar6 = pNtk->vObjs->nSize;
        uVar2 = (long)iVar6 + 500;
        iVar7 = (int)uVar2;
        if ((pNtk->vTravIds).nCap < iVar7) {
          piVar12 = (int *)malloc(uVar2 * 4);
          (pNtk->vTravIds).pArray = piVar12;
          if (piVar12 == (int *)0x0) goto LAB_00456959;
          (pNtk->vTravIds).nCap = iVar7;
          uVar19 = extraout_RDX_00;
        }
        else {
          piVar12 = (int *)0x0;
        }
        if (-500 < iVar6) {
          memset(piVar12,0,(uVar2 & 0xffffffff) << 2);
          uVar19 = extraout_RDX_01;
        }
        (pNtk->vTravIds).nSize = iVar7;
      }
      iVar6 = pNtk->nTravIds;
      pNtk->nTravIds = iVar6 + 1;
      if (0x3ffffffe < iVar6) goto LAB_0045693a;
      iVar6 = pVVar11->nSize;
      if (0 < iVar6) {
        lVar8 = 0;
        do {
          plVar4 = (long *)pVVar11->pArray[lVar8];
          pAVar13 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PI);
          plVar4[8] = (long)pAVar13;
          lVar17 = *plVar4;
          iVar6 = (int)plVar4[2];
          uVar3 = *(undefined4 *)(lVar17 + 0xd8);
          Vec_IntFillExtra((Vec_Int_t *)(lVar17 + 0xe0),iVar6 + 1,Fill);
          if (((long)iVar6 < 0) || (*(int *)(lVar17 + 0xe4) <= iVar6)) goto LAB_0045691b;
          *(undefined4 *)(*(long *)(lVar17 + 0xe8) + (long)iVar6 * 4) = uVar3;
          lVar8 = lVar8 + 1;
          iVar6 = pVVar11->nSize;
          uVar19 = extraout_RDX_02;
        } while (lVar8 < iVar6);
      }
      pVVar14 = pNtk->vBoxes;
      if (0 < pVVar14->nSize) {
        lVar8 = 0;
        do {
          plVar4 = (long *)pVVar14->pArray[lVar8];
          uVar16 = *(uint *)((long)plVar4 + 0x14) & 0xf;
          uVar19 = (ulong)uVar16;
          if (uVar16 == 8) {
            pAVar13 = Abc_NtkRetimeMinAreaConstructNtk_rec
                                (pNtk_00,*(Abc_Obj_t **)
                                          (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                          (long)*(int *)plVar4[4] * 8));
            pObj = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
            Abc_ObjAddFanin(pObj,pAVar13);
            pVVar14 = pNtk->vBoxes;
            uVar19 = extraout_RDX_03;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar14->nSize);
        iVar6 = pVVar11->nSize;
      }
      if (0 < iVar6) {
        lVar8 = 0;
        do {
          lVar17 = *pVVar11->pArray[lVar8];
          iVar6 = (int)*(long *)((long)pVVar11->pArray[lVar8] + 0x10);
          iVar7 = *(int *)(lVar17 + 0xd8);
          Vec_IntFillExtra((Vec_Int_t *)(lVar17 + 0xe0),iVar6 + 1,(int)uVar19);
          if (((long)iVar6 < 0) || (*(int *)(lVar17 + 0xe4) <= iVar6)) goto LAB_0045691b;
          *(int *)(*(long *)(lVar17 + 0xe8) + (long)iVar6 * 4) = iVar7 + -1;
          lVar8 = lVar8 + 1;
          uVar19 = extraout_RDX_04;
        } while (lVar8 < pVVar11->nSize);
        pVVar14 = pNtk->vBoxes;
      }
      if (0 < pVVar14->nSize) {
        lVar8 = 0;
        do {
          plVar4 = (long *)pVVar14->pArray[lVar8];
          if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
            lVar17 = *plVar4;
            iVar6 = (int)plVar4[2];
            iVar7 = *(int *)(lVar17 + 0xd8);
            Vec_IntFillExtra((Vec_Int_t *)(lVar17 + 0xe0),iVar6 + 1,8);
            if (((long)iVar6 < 0) || (*(int *)(lVar17 + 0xe4) <= iVar6)) goto LAB_0045691b;
            *(int *)(*(long *)(lVar17 + 0xe8) + (long)iVar6 * 4) = iVar7 + -1;
            pVVar14 = pNtk->vBoxes;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar14->nSize);
      }
      Abc_NtkAddDummyPiNames(pNtk_00);
      Abc_NtkAddDummyPoNames(pNtk_00);
      iVar7 = Abc_NtkCheck(pNtk_00);
      iVar6 = 0;
      if (iVar7 == 0) {
        fwrite("Abc_NtkRetimeMinAreaConstructNtk(): Network check has failed.\n",0x3e,1,_stdout);
        iVar6 = 0;
      }
    }
    else {
      if ((pNtk->vTravIds).pArray == (int *)0x0) {
        iVar6 = pNtk->vObjs->nSize;
        uVar19 = (long)iVar6 + 500;
        iVar7 = (int)uVar19;
        if ((pNtk->vTravIds).nCap < iVar7) {
          piVar12 = (int *)malloc(uVar19 * 4);
          (pNtk->vTravIds).pArray = piVar12;
          if (piVar12 == (int *)0x0) {
LAB_00456959:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          (pNtk->vTravIds).nCap = iVar7;
        }
        else {
          piVar12 = (int *)0x0;
        }
        if (-500 < iVar6) {
          memset(piVar12,0,(uVar19 & 0xffffffff) << 2);
        }
        (pNtk->vTravIds).nSize = iVar7;
      }
      iVar6 = pNtk->nTravIds;
      pNtk->nTravIds = iVar6 + 1;
      if (0x3ffffffe < iVar6) {
LAB_0045693a:
        __assert_fail("p->nTravIds < (1<<30)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                      ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
      }
      pVVar14 = pNtk->vBoxes;
      if (0 < pVVar14->nSize) {
        lVar8 = 0;
        do {
          plVar4 = (long *)pVVar14->pArray[lVar8];
          if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
            lVar17 = *plVar4;
            plVar4[8] = (ulong)(plVar4[7] == 2);
            iVar6 = (int)plVar4[2];
            uVar3 = *(undefined4 *)(lVar17 + 0xd8);
            Vec_IntFillExtra((Vec_Int_t *)(lVar17 + 0xe0),iVar6 + 1,8);
            if (((long)iVar6 < 0) || (*(int *)(lVar17 + 0xe4) <= iVar6)) goto LAB_0045691b;
            *(undefined4 *)(*(long *)(lVar17 + 0xe8) + (long)iVar6 * 4) = uVar3;
            pVVar14 = pNtk->vBoxes;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar14->nSize);
      }
      if (0 < pVVar11->nSize) {
        lVar8 = 0;
        do {
          Abc_NtkRetimeMinAreaInitValues_rec((Abc_Obj_t *)pVVar11->pArray[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar11->nSize);
        pVVar14 = pNtk->vBoxes;
      }
      pNtk_00 = (Abc_Ntk_t *)0x1;
      iVar6 = 1;
      if (0 < pVVar14->nSize) {
        lVar8 = 0;
        do {
          plVar4 = (long *)pVVar14->pArray[lVar8];
          if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
            lVar17 = *plVar4;
            iVar6 = (int)plVar4[2];
            iVar7 = *(int *)(lVar17 + 0xd8);
            Vec_IntFillExtra((Vec_Int_t *)(lVar17 + 0xe0),iVar6 + 1,8);
            if (((long)iVar6 < 0) || (*(int *)(lVar17 + 0xe4) <= iVar6)) {
LAB_0045691b:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(int *)(*(long *)(lVar17 + 0xe8) + (long)iVar6 * 4) = iVar7 + -1;
            pVVar14 = pNtk->vBoxes;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar14->nSize);
        iVar6 = 1;
      }
    }
    Abc_NtkRetimeMinAreaUpdateLatches(pNtk,pVVar11,iVar6);
  }
  else {
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  if (pVVar11->pArray != (void **)0x0) {
    free(pVVar11->pArray);
  }
  free(pVVar11);
  Abc_NtkCleanMarkA(pNtk);
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkRetimeMinAreaOne( Abc_Ntk_t * pNtk, int fForward, int fVerbose )
{ 
    Abc_Ntk_t * pNtkNew = NULL;
    Vec_Ptr_t * vMinCut;
    // mark current latches and TFI(POs)
    Abc_NtkRetimeMinAreaPrepare( pNtk, fForward );
    // run the maximum forward flow
    vMinCut = Abc_NtkMaxFlow( pNtk, fForward, fVerbose );
//    assert( Vec_PtrSize(vMinCut) <= Abc_NtkLatchNum(pNtk) );
    // create new latch boundary if there is improvement
    if ( Vec_PtrSize(vMinCut) < Abc_NtkLatchNum(pNtk) )
    {
        pNtkNew = (Abc_Ntk_t *)1;
        if ( fForward )
            Abc_NtkRetimeMinAreaInitValues( pNtk, vMinCut );
        else
            pNtkNew = Abc_NtkRetimeMinAreaConstructNtk( pNtk, vMinCut );
        Abc_NtkRetimeMinAreaUpdateLatches( pNtk, vMinCut, fForward );
    }
    // clean up
    Vec_PtrFree( vMinCut );
    Abc_NtkCleanMarkA( pNtk );
    return pNtkNew;
}